

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void traverse_hplane_csc<PredictionData<float,unsigned_long>,unsigned_long>
               (WorkerForPredictCSC *workspace,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,ExtIsoForest *model_outputs,
               PredictionData<float,_unsigned_long> *prediction_data,unsigned_long *tree_num,
               double *per_tree_depths,size_t curr_tree,bool has_range_penalty)

{
  int iVar1;
  CategSplit cat_split_type;
  pointer pdVar2;
  size_t sVar3;
  ulong uVar4;
  unsigned_long uVar5;
  long lVar6;
  long lVar7;
  pointer pIVar8;
  size_t sVar9;
  long lVar10;
  size_t col;
  ulong uVar11;
  pointer puVar12;
  int ncat;
  ulong uVar13;
  double *pdVar14;
  size_t row_2;
  double *pdVar15;
  size_t sVar16;
  long lVar17;
  double dVar18;
  double unused;
  long local_58;
  double local_38;
  
  pIVar8 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar8[curr_tree].hplane_left == 0) {
    puVar12 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar4 = workspace->end;
    pdVar2 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = workspace->st;
    for (uVar13 = uVar11; uVar13 <= uVar4; uVar13 = uVar13 + 1) {
      uVar5 = puVar12[uVar13];
      pdVar2[uVar5] = pIVar8[curr_tree].score + pdVar2[uVar5];
    }
    if (tree_num != (unsigned_long *)0x0) {
      puVar12 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (uVar13 = uVar11; uVar13 <= uVar4; uVar13 = uVar13 + 1) {
        tree_num[puVar12[uVar13]] = curr_tree;
      }
    }
    if (per_tree_depths != (double *)0x0) {
      puVar12 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (; uVar11 <= uVar4; uVar11 = uVar11 + 1) {
        per_tree_depths[puVar12[uVar11]] = pIVar8[curr_tree].score;
      }
    }
  }
  else {
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start + workspace->st);
    pdVar2 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = workspace->st;
    sVar3 = workspace->end;
    for (lVar10 = 0; sVar3 * 8 + sVar9 * -8 + 8 != lVar10; lVar10 = lVar10 + 8) {
      *(undefined8 *)((long)pdVar2 + lVar10) = 0;
    }
    if (prediction_data->categ_data == (int *)0x0) {
      lVar10 = 0;
      uVar11 = 0;
      while( true ) {
        pIVar8 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar17 = *(long *)&pIVar8[curr_tree].col_num.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        ;
        if ((ulong)((long)*(pointer *)
                           ((long)&pIVar8[curr_tree].col_num.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl + 8) - lVar17 >> 3) <= uVar11) break;
        pdVar15 = &local_38;
        if (model_outputs->missing_action != Fail) {
          pdVar15 = (double *)
                    (*(long *)&pIVar8[curr_tree].fill_val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + lVar10);
        }
        add_linear_comb<float,unsigned_long>
                  ((workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,workspace->st,workspace->end,
                   *(size_t *)(lVar17 + lVar10),
                   (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start,prediction_data->Xc,prediction_data->Xc_ind,
                   prediction_data->Xc_indptr,
                   (double *)
                   (*(long *)&pIVar8[curr_tree].coef.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + lVar10),0.0,
                   *(double *)
                    (*(long *)&pIVar8[curr_tree].mean.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + lVar10),pdVar15,
                   model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 8;
      }
    }
    else {
      lVar17 = 0;
      local_58 = 0;
      lVar10 = 0;
      uVar11 = 0;
      while( true ) {
        pIVar8 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = *(long *)&pIVar8[curr_tree].col_num.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&pIVar8[curr_tree].col_num.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl + 8) - lVar6 >> 3) <= uVar11) break;
        iVar1 = *(int *)(*(long *)&pIVar8[curr_tree].col_type.
                                   super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
                                   super__Vector_impl_data + uVar11 * 4);
        if (iVar1 == 0x20) {
          cat_split_type = model_outputs->cat_split_type;
          if (cat_split_type == SingleCateg) {
            dVar18 = *(double *)
                      (*(long *)&pIVar8[curr_tree].fill_new.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + lVar10 * 8);
            iVar1 = *(int *)(*(long *)&pIVar8[curr_tree].chosen_cat.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + lVar10 * 4);
LAB_002dd04d:
            ncat = 0;
            pdVar15 = (double *)0x0;
          }
          else {
            iVar1 = 0;
            dVar18 = 0.0;
            if (cat_split_type != SubSet) goto LAB_002dd04d;
            lVar7 = *(long *)&pIVar8[curr_tree].cat_coef.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            pdVar15 = *(double **)(lVar7 + lVar10 * 0x18);
            ncat = (int)((ulong)(*(long *)(lVar7 + 8 + lVar10 * 0x18) - (long)pdVar15) >> 3);
          }
          add_linear_comb<double>
                    ((workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,workspace->st,workspace->end,
                     (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     prediction_data->categ_data +
                     prediction_data->nrows * *(long *)(lVar6 + lVar17),ncat,pdVar15,dVar18,iVar1,
                     (double *)
                     (*(long *)&pIVar8[curr_tree].fill_val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + lVar17),
                     (double *)
                     (lVar10 * 8 +
                     *(long *)&pIVar8[curr_tree].fill_new.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data),(size_t *)0x0,(size_t *)0x0,
                     model_outputs->new_cat_action,model_outputs->missing_action,cat_split_type,
                     false);
          lVar10 = lVar10 + 1;
        }
        else if (iVar1 == 0x1f) {
          pdVar15 = &local_38;
          if (model_outputs->missing_action != Fail) {
            pdVar15 = (double *)
                      (*(long *)&pIVar8[curr_tree].fill_val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + lVar17);
          }
          add_linear_comb<float,unsigned_long>
                    ((workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,workspace->st,workspace->end,
                     *(size_t *)(lVar6 + lVar17),
                     (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,prediction_data->Xc,
                     prediction_data->Xc_ind,prediction_data->Xc_indptr,
                     (double *)
                     (local_58 * 8 +
                     *(long *)&pIVar8[curr_tree].coef.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data),0.0,
                     *(double *)
                      (*(long *)&pIVar8[curr_tree].mean.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + local_58 * 8),pdVar15,
                     model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
          local_58 = local_58 + 1;
        }
        uVar11 = uVar11 + 1;
        lVar17 = lVar17 + 8;
      }
    }
    puVar12 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar9 = workspace->st;
    pdVar15 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar3 = workspace->end;
    if (has_range_penalty) {
      pdVar2 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar14 = pdVar15;
      for (sVar16 = sVar9; sVar16 <= sVar3; sVar16 = sVar16 + 1) {
        dVar18 = 1.0;
        if (pIVar8[curr_tree].range_low <= *pdVar14) {
          dVar18 = (double)(-(ulong)(pIVar8[curr_tree].range_high < *pdVar14) & 0x3ff0000000000000);
        }
        pdVar2[puVar12[sVar16]] = pdVar2[puVar12[sVar16]] - dVar18;
        pdVar14 = pdVar14 + 1;
      }
      puVar12 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    sVar9 = divide_subset_split(puVar12,pdVar15,sVar9,sVar3,pIVar8[curr_tree].split_point);
    uVar11 = workspace->end;
    if (workspace->st < sVar9) {
      workspace->end = sVar9 - 1;
      traverse_hplane_csc<PredictionData<float,unsigned_long>,unsigned_long>
                (workspace,hplanes,model_outputs,prediction_data,tree_num,per_tree_depths,
                 (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].hplane_left,has_range_penalty);
    }
    if (sVar9 <= uVar11) {
      workspace->st = sVar9;
      workspace->end = uVar11;
      traverse_hplane_csc<PredictionData<float,unsigned_long>,unsigned_long>
                (workspace,hplanes,model_outputs,prediction_data,tree_num,per_tree_depths,
                 (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].hplane_right,has_range_penalty);
    }
  }
  return;
}

Assistant:

void traverse_hplane_csc(WorkerForPredictCSC      &workspace,
                         std::vector<IsoHPlane>   &hplanes,
                         ExtIsoForest             &model_outputs,
                         PredictionData           &prediction_data,
                         sparse_ix *restrict      tree_num,
                         double *restrict         per_tree_depths,
                         size_t                   curr_tree,
                         bool                     has_range_penalty)
{
    // if (hplanes[curr_tree].score >= 0)
    if (unlikely(hplanes[curr_tree].hplane_left == 0))
    {
        for (size_t row = workspace.st; row <= workspace.end; row++)
            workspace.depths[workspace.ix_arr[row]] += hplanes[curr_tree].score;
        if (unlikely(tree_num != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                tree_num[workspace.ix_arr[row]] = curr_tree;
        if (unlikely(per_tree_depths != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                per_tree_depths[workspace.ix_arr[row]] = hplanes[curr_tree].score;
        return;
    }

    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
    std::fill(workspace.comb_val.begin(), workspace.comb_val.begin() + (workspace.end - workspace.st + 1), 0.);
    double unused;

    if (likely(prediction_data.categ_data == NULL))
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
            add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                            hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                            prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                            hplanes[curr_tree].coef[col], (double)0, hplanes[curr_tree].mean[col],
                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                            model_outputs.missing_action, NULL, NULL, false);
    }

    else
    {
        size_t ncols_numeric = 0;
        size_t ncols_categ = 0;
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
        {
            switch (hplanes[curr_tree].col_type[col])
            {
                case Numeric:
                {
                    add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                                    hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                                    prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                    hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                    (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                    model_outputs.missing_action, NULL, NULL, false);
                    ncols_numeric++;
                    break;
                }

                case Categorical:
                {
                    add_linear_comb<double>(
                                    workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                    prediction_data.categ_data + hplanes[curr_tree].col_num[col] * prediction_data.nrows,
                                    (model_outputs.cat_split_type == SubSet)? (int)hplanes[curr_tree].cat_coef[ncols_categ].size() : 0,
                                    (model_outputs.cat_split_type == SubSet)? hplanes[curr_tree].cat_coef[ncols_categ].data() : NULL,
                                    (model_outputs.cat_split_type == SingleCateg)? hplanes[curr_tree].fill_new[ncols_categ] : 0.,
                                    (model_outputs.cat_split_type == SingleCateg)? hplanes[curr_tree].chosen_cat[ncols_categ] : 0,
                                    hplanes[curr_tree].fill_val[col], hplanes[curr_tree].fill_new[ncols_categ], NULL, NULL,
                                    model_outputs.new_cat_action, model_outputs.missing_action, model_outputs.cat_split_type, false);
                    ncols_categ++;
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }

    if (has_range_penalty)
    {
        for (size_t row = workspace.st; row <= workspace.end; row++)
            workspace.depths[workspace.ix_arr[row]]
                -=
            (workspace.comb_val[row - workspace.st] < hplanes[curr_tree].range_low) ||
            (workspace.comb_val[row - workspace.st] > hplanes[curr_tree].range_high);
    }

    /* divide data */
    size_t split_ix = divide_subset_split(workspace.ix_arr.data(), workspace.comb_val.data(),
                                          workspace.st, workspace.end, hplanes[curr_tree].split_point);

    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (split_ix > workspace.st)
    {
        workspace.end = split_ix - 1;
        traverse_hplane_csc(workspace,
                            hplanes,
                            model_outputs,
                            prediction_data,
                            tree_num,
                            per_tree_depths,
                            hplanes[curr_tree].hplane_left,
                            has_range_penalty);
    }

    if (split_ix <= orig_end)
    {
        workspace.st  = split_ix;
        workspace.end = orig_end;
        traverse_hplane_csc(workspace,
                            hplanes,
                            model_outputs,
                            prediction_data,
                            tree_num,
                            per_tree_depths,
                            hplanes[curr_tree].hplane_right,
                            has_range_penalty);
    }
}